

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  cmMakefile *pcVar1;
  char *__rhs;
  pointer puVar2;
  cmInstallGenerator *pcVar3;
  pointer pbVar4;
  bool bVar5;
  PolicyStatus PVar6;
  cmValue cVar7;
  ostream *poVar8;
  PolicyID id;
  pointer this_00;
  const_iterator __begin2;
  pointer puVar9;
  string *psVar10;
  string *configurationType;
  char **c;
  undefined8 *puVar11;
  bool haveInstallAfterSubdirectory;
  char local_513;
  bool haveSubdirectoryInstall;
  allocator<char> local_511;
  string odir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  string default_config;
  string config;
  string prefix;
  string homedir;
  string file;
  ostringstream e;
  cmGeneratedFileStream fout;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&e);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  psVar10 = cVar7.Value;
  if (cVar7.Value == (string *)0x0) {
    psVar10 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&prefix,(string *)psVar10);
  if (cVar7.Value == (string *)0x0) {
    std::__cxx11::string::assign((char *)&prefix);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_STAGING_PREFIX",(allocator<char> *)&e);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (cVar7.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&prefix);
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configurationTypes,this->Makefile,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&config,this->Makefile);
  std::__cxx11::string::string((string *)&default_config,(string *)&config);
  puVar11 = &DAT_008a30b0;
  while ((pbVar4 = configurationTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, __rhs = (char *)*puVar11,
         __rhs != (char *)0x0 &&
         (psVar10 = configurationTypes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, default_config._M_string_length == 0)
         )) {
    for (; psVar10 != pbVar4; psVar10 = psVar10 + 1) {
      cmsys::SystemTools::UpperCase((string *)&fout,psVar10);
      bVar5 = std::operator==((string *)&fout,__rhs);
      std::__cxx11::string::~string((string *)&fout);
      if (bVar5) {
        std::__cxx11::string::_M_assign((string *)&default_config);
      }
    }
    puVar11 = puVar11 + 1;
  }
  if ((default_config._M_string_length == 0) &&
     (configurationTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      configurationTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::_M_assign((string *)&default_config);
  }
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)&fout,&(this->super_cmOutputConverter).StateSnapshot);
  psVar10 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&fout);
  std::__cxx11::string::string((string *)&file,(string *)psVar10);
  psVar10 = cmState::GetBinaryDirectory_abi_cxx11_
                      ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  std::__cxx11::string::string((string *)&homedir,(string *)psVar10);
  local_513 = std::operator==(&file,&homedir);
  std::__cxx11::string::append((char *)&file);
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&file,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  poVar8 = std::operator<<((ostream *)&fout,"# Install script for directory: ");
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)&e,&(this->super_cmOutputConverter).StateSnapshot);
  psVar10 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&e);
  poVar8 = std::operator<<(poVar8,(string *)psVar10);
  poVar8 = std::operator<<(poVar8,
                           "\n\n# Set the install prefix\nif(NOT DEFINED CMAKE_INSTALL_PREFIX)\n  set(CMAKE_INSTALL_PREFIX \""
                          );
  poVar8 = std::operator<<(poVar8,(string *)&prefix);
  poVar8 = std::operator<<(poVar8,"\")\nendif()\n");
  poVar8 = std::operator<<(poVar8,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ");
  std::operator<<(poVar8,"\"${CMAKE_INSTALL_PREFIX}\")\n\n");
  poVar8 = std::operator<<((ostream *)&fout,
                           "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
                          );
  poVar8 = std::operator<<(poVar8,(string *)&default_config);
  std::operator<<(poVar8,
                  "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
                 );
  std::operator<<((ostream *)&fout,
                  "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
                 );
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_INSTALL_SO_NO_EXE",(allocator<char> *)&odir);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar7.Value != (string *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)cVar7.Value);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_CROSSCOMPILING",(allocator<char> *)&odir);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar7.Value != (string *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Is this installation the result of a crosscompile?\nif(NOT DEFINED CMAKE_CROSSCOMPILING)\n  set(CMAKE_CROSSCOMPILING \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)cVar7.Value);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",(allocator<char> *)&odir);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar7.Value != (string *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)cVar7.Value);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM",(allocator<char> *)&odir);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar7.Value != (string *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)cVar7.Value);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL",(allocator<char> *)&odir);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar7.Value != (string *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)cVar7.Value);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND",(allocator<char> *)&odir);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar7.Value != (string *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)cVar7.Value);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_OBJDUMP",(allocator<char> *)&odir);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (cVar7.Value != (string *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_OBJDUMP)\n  set(CMAKE_OBJDUMP \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)cVar7.Value);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  (*this->_vptr_cmLocalGenerator[0x12])(this,&fout);
  PVar6 = GetPolicyStatus(this,CMP0082);
  haveSubdirectoryInstall = false;
  haveInstallAfterSubdirectory = false;
  puVar9 = (this->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (PVar6 == WARN) {
    for (; puVar9 != puVar2; puVar9 = puVar9 + 1) {
      pcVar3 = (puVar9->_M_t).
               super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
               .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
      (**(code **)((long)(pcVar3->super_cmScriptGenerator)._vptr_cmScriptGenerator + 0x48))
                (pcVar3,&haveSubdirectoryInstall,&haveInstallAfterSubdirectory);
      cmScriptGenerator::Generate
                (&((puVar9->_M_t).
                   super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                   .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl)->
                  super_cmScriptGenerator,(ostream *)&fout,&config,&configurationTypes);
    }
  }
  else {
    for (; puVar9 != puVar2; puVar9 = puVar9 + 1) {
      cmScriptGenerator::Generate
                (&((puVar9->_M_t).
                   super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                   .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl)->
                  super_cmScriptGenerator,(ostream *)&fout,&config,&configurationTypes);
    }
  }
  GenerateTargetInstallRules(this,(ostream *)&fout,&config,&configurationTypes);
  if (PVar6 != OLD) {
    if (PVar6 != WARN) goto LAB_0038efff;
    if (haveInstallAfterSubdirectory == true) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CMAKE_POLICY_WARNING_CMP0082",(allocator<char> *)&odir);
      bVar5 = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&odir,(cmPolicies *)0x52,id);
        poVar8 = std::operator<<((ostream *)&e,(string *)&odir);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&odir);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,AUTHOR_WARNING,&odir);
        std::__cxx11::string::~string((string *)&odir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
  }
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmStateSnapshot::GetChildren(&children,(cmStateSnapshot *)&e);
  if (children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::operator<<((ostream *)&fout,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
    std::operator<<((ostream *)&fout,"  # Include the install script for each subdirectory.\n");
    for (this_00 = children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&e,this_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&odir,"EXCLUDE_FROM_ALL",&local_511);
      bVar5 = cmStateDirectory::GetPropertyAsBool((cmStateDirectory *)&e,&odir);
      std::__cxx11::string::~string((string *)&odir);
      if (!bVar5) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)&e,this_00);
        psVar10 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&e);
        std::__cxx11::string::string((string *)&odir,(string *)psVar10);
        cmsys::SystemTools::ConvertToUnixSlashes(&odir);
        poVar8 = std::operator<<((ostream *)&fout,"  include(\"");
        poVar8 = std::operator<<(poVar8,(string *)&odir);
        std::operator<<(poVar8,"/cmake_install.cmake\")\n");
        std::__cxx11::string::~string((string *)&odir);
      }
    }
    std::operator<<((ostream *)&fout,"\n");
    std::operator<<((ostream *)&fout,"endif()\n\n");
  }
  std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base
            (&children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>);
LAB_0038efff:
  if (local_513 != '\0') {
    poVar8 = std::operator<<((ostream *)&fout,
                             "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)&homedir);
    std::operator<<(poVar8,
                    "/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&homedir);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&default_config);
  std::__cxx11::string::~string((string *)&config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurationTypes);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  cmValue installPrefix =
    this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");
  std::string prefix = installPrefix;

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (!installPrefix) {
    if (!cmSystemTools::GetEnv("SystemDrive", prefix)) {
      prefix = "C:";
    }
    cmValue project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if (cmNonempty(project_name)) {
      prefix += "/Program Files/";
      prefix += *project_name;
    } else {
      prefix += "/InstalledCMakeProject";
    }
  }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!installPrefix) {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir)) ==
        B_OK) {
      prefix = dir;
    } else {
      prefix = "/boot/system";
    }
  }
#else
  if (!installPrefix) {
    prefix = "/usr/local";
  }
#endif
  if (cmValue stagingPrefix =
        this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX")) {
    prefix = *stagingPrefix;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes =
    this->Makefile->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = this->Makefile->GetDefaultConfiguration();

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = { "RELEASE", "MINSIZEREL", "RELWITHDEBINFO",
                                  "DEBUG", nullptr };
  for (const char** c = default_order; *c && default_config.empty(); ++c) {
    for (std::string const& configurationType : configurationTypes) {
      if (cmSystemTools::UpperCase(configurationType) == *c) {
        default_config = configurationType;
      }
    }
  }
  if (default_config.empty() && !configurationTypes.empty()) {
    default_config = configurationTypes[0];
  }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir) {
    toplevel_install = 1;
  }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  // Write the header.
  /* clang-format off */
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << "\n\n"
          "# Set the install prefix\n"
          "if(NOT DEFINED CMAKE_INSTALL_PREFIX)\n"
          "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")\n"
          "endif()\n"
       << R"(string(REGEX REPLACE "/$" "" CMAKE_INSTALL_PREFIX )"
       << "\"${CMAKE_INSTALL_PREFIX}\")\n\n";
  /* clang-format on */

  // Write support code for generating per-configuration install rules.
  /* clang-format off */
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Write support code for dealing with component-specific installs.
  /* clang-format off */
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Copy user-specified install options to the install code.
  if (cmValue so_no_exe =
        this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE")) {
    /* clang-format off */
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << *so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Copy cmake cross compile state to install code.
  if (cmValue crosscompiling =
        this->Makefile->GetDefinition("CMAKE_CROSSCOMPILING")) {
    /* clang-format off */
    fout <<
      "# Is this installation the result of a crosscompile?\n"
      "if(NOT DEFINED CMAKE_CROSSCOMPILING)\n"
      "  set(CMAKE_CROSSCOMPILING \"" << *crosscompiling << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write default directory permissions.
  if (cmValue defaultDirPermissions = this->Makefile->GetDefinition(
        "CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n"
      "  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
         << *defaultDirPermissions << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same platform variable as when running cmake
  if (cmValue platform = this->Makefile->GetDefinition(
        "CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM \""
         << *platform << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same tool selected as when running cmake
  if (cmValue command =
        this->Makefile->GetDefinition("CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same path to the tool as when running cmake
  if (cmValue command = this->Makefile->GetDefinition(
        "CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_OBJDUMP so that installed code that uses
  // `file(GET_RUNTIME_DEPENDENCIES)` and hasn't specified
  // CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND has consistent
  // logic to fallback to CMAKE_OBJDUMP when `objdump` is
  // not on the path
  if (cmValue command = this->Makefile->GetDefinition("CMAKE_OBJDUMP")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_OBJDUMP)\n"
      "  set(CMAKE_OBJDUMP \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  this->AddGeneratorSpecificInstallSetup(fout);

  // Ask each install generator to write its code.
  cmPolicies::PolicyStatus status = this->GetPolicyStatus(cmPolicies::CMP0082);
  auto const& installers = this->Makefile->GetInstallGenerators();
  bool haveSubdirectoryInstall = false;
  bool haveInstallAfterSubdirectory = false;
  if (status == cmPolicies::WARN) {
    for (const auto& installer : installers) {
      installer->CheckCMP0082(haveSubdirectoryInstall,
                              haveInstallAfterSubdirectory);
      installer->Generate(fout, config, configurationTypes);
    }
  } else {
    for (const auto& installer : installers) {
      installer->Generate(fout, config, configurationTypes);
    }
  }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  switch (status) {
    case cmPolicies::WARN:
      if (haveInstallAfterSubdirectory &&
          this->Makefile->PolicyOptionalWarningEnabled(
            "CMAKE_POLICY_WARNING_CMP0082")) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0082) << "\n";
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      std::vector<cmStateSnapshot> children =
        this->Makefile->GetStateSnapshot().GetChildren();
      if (!children.empty()) {
        fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
        fout << "  # Include the install script for each subdirectory.\n";
        for (cmStateSnapshot const& c : children) {
          if (!c.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
            std::string odir = c.GetDirectory().GetCurrentBinary();
            cmSystemTools::ConvertToUnixSlashes(odir);
            fout << "  include(\"" << odir << "/cmake_install.cmake\")\n";
          }
        }
        fout << "\n";
        fout << "endif()\n\n";
      }
    } break;

    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is handled in
      // cmInstallSubdirectoryGenerator::GenerateScript()
      break;
  }

  // Record the install manifest.
  if (toplevel_install) {
    /* clang-format off */
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    /* clang-format on */
  }
}